

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

void __thiscall hmi::window::~window(window *this)

{
  int iVar1;
  long *in_RDI;
  bool bVar2;
  
  if (*in_RDI != 0) {
    SDL_DestroyWindow(*in_RDI);
  }
  LOCK();
  iVar1 = (anonymous_namespace)::g_loaded + -1;
  UNLOCK();
  bVar2 = (anonymous_namespace)::g_loaded == 1;
  (anonymous_namespace)::g_loaded = iVar1;
  if (bVar2) {
    SDL_Quit();
  }
  return;
}

Assistant:

window::~window() {
    if (m_window != nullptr) {
      SDL_DestroyWindow(m_window);
    }

    if (g_loaded.fetch_sub(1) == 1) { // we are the last
      SDL_Quit();
    }
  }